

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O1

void __thiscall
ElementsConfidentialAddress_P2wshAddressToConfidential_Test::TestBody
          (ElementsConfidentialAddress_P2wshAddressToConfidential_Test *this)

{
  bool bVar1;
  ElementsNetType EVar2;
  ElementsAddressType EVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialKey confidential_key;
  AssertionResult gtest_ar_4;
  ElementsConfidentialAddress confidential_address;
  Address address;
  string local_590;
  undefined1 local_570 [16];
  undefined1 local_560 [40];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_538;
  Pubkey local_520;
  undefined1 local_508 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8 [23];
  pointer local_388;
  pointer local_378;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  ElementsConfidentialAddress local_350;
  Address local_198;
  
  cfd::core::Address::Address(&local_198);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_350);
  local_508 = (undefined1  [8])local_4f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_508,
             "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800","");
  cfd::core::Pubkey::Pubkey(&local_520,(string *)local_508);
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,local_4f8[0]._M_allocated_capacity + 1);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_590,"a91429b1ec079a9c6a45a4e9ab38c3aa3e0ad3dc61f088","");
      cfd::core::Script::Script((Script *)local_570,&local_590);
      cfd::core::GetElementsAddressFormatList();
      cfd::core::Address::Address
                ((Address *)local_508,kCfdInvalidSettingError,kVersion0,(Script *)local_570,
                 (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  *)(local_560 + 0x28));
      cfd::core::Address::operator=(&local_198,(Address *)local_508);
      cfd::core::Address::~Address((Address *)local_508);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_560 + 0x28));
      cfd::core::Script::~Script((Script *)local_570);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x208,
               "Expected: (address = Address(ElementsNetType::kElementsRegtest, WitnessVersion::kVersion0, Script(\"a91429b1ec079a9c6a45a4e9ab38c3aa3e0ad3dc61f088\"), GetElementsAddressFormatList())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_570,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_570);
    if (local_508 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_508 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_508 + 8))();
      }
      local_508 = (undefined1  [8])0x0;
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)local_508,&local_198,&local_520);
      cfd::core::ElementsConfidentialAddress::operator=
                (&local_350,(ElementsConfidentialAddress *)local_508);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_p != &local_360) {
        operator_delete(local_370._M_p,local_360._M_allocated_capacity + 1);
      }
      if (local_388 != (pointer)0x0) {
        operator_delete(local_388,(long)local_378 - (long)local_388);
      }
      cfd::core::Address::~Address((Address *)local_508);
    }
  }
  else {
    testing::Message::Message((Message *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x20b,
               "Expected: (confidential_address = ElementsConfidentialAddress(address, confidential_key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_570,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_570);
    if (local_508 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_508 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_508 + 8))();
      }
      local_508 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_508,&local_350);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_570,
             "\"el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz\""
             ,"confidential_address.GetAddress().c_str()",
             "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz"
             ,(char *)local_508);
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,local_4f8[0]._M_allocated_capacity + 1);
  }
  if (local_570[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_508);
    if ((pointer)local_570._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_570._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x20e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_590,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_590);
    if (local_508 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_508 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_508 + 8))();
      }
      local_508 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_570 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ElementsConfidentialAddress::GetConfidentialKey
            ((ConfidentialKey *)local_570,&local_350);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_508,(Pubkey *)local_570);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_590,
             "\"03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800\"",
             "confidential_address.GetConfidentialKey().GetHex().c_str()",
             "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",(char *)local_508)
  ;
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,local_4f8[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_570._0_8_,local_560._0_8_ - local_570._0_8_);
  }
  if ((char)local_590._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_508);
    if ((undefined8 *)local_590._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_590._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x211,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_570,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_570);
    if (local_508 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_508 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_508 + 8))();
      }
      local_508 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_590._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetHash((ByteData *)local_570,&local_350);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_508,(ByteData *)local_570);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_590,
             "\"332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6\"",
             "confidential_address.GetHash().GetHex().c_str()",
             "332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6",(char *)local_508);
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,local_4f8[0]._M_allocated_capacity + 1);
  }
  if ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_570._0_8_,local_560._0_8_ - local_570._0_8_);
  }
  if ((char)local_590._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_508);
    if ((undefined8 *)local_590._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_590._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x213,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_570,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_570);
    if (local_508 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_508 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_508 + 8))();
      }
      local_508 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_590._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress((Address *)local_508,&local_350);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_570,(Address *)local_508);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_590,
             "\"ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g\"",
             "confidential_address.GetUnblindedAddress().GetAddress().c_str()",
             "ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",
             (char *)local_570._0_8_);
  if ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)local_560) {
    operator_delete((void *)local_570._0_8_,(ulong)(local_560._0_8_ + 1));
  }
  cfd::core::Address::~Address((Address *)local_508);
  if ((char)local_590._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_508);
    if ((undefined8 *)local_590._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_590._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_570,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x215,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_570,(Message *)local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_570);
    if (local_508 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_508 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_508 + 8))();
      }
      local_508 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_590._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_((string *)local_508,&local_350);
  bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_508);
  local_570[0] = (internal)bVar1;
  local_570._8_8_ = (pointer)0x0;
  if (local_508 != (undefined1  [8])local_4f8) {
    operator_delete((void *)local_508,local_4f8[0]._M_allocated_capacity + 1);
  }
  if (local_570[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_508,(internal *)local_570,
               (AssertionResult *)
               "ElementsConfidentialAddress::IsConfidentialAddress(confidential_address.GetAddress())"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_560 + 0x28),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x217,(char *)local_508);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_560 + 0x28),(Message *)&local_590);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_560 + 0x28));
    if (local_508 != (undefined1  [8])local_4f8) {
      operator_delete((void *)local_508,local_4f8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_590._M_dataplus._M_p + 8))();
      }
      local_590._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_570 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_570._0_4_ = 4;
  EVar2 = cfd::core::ElementsConfidentialAddress::GetNetType(&local_350);
  local_590._M_dataplus._M_p._0_4_ = EVar2;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_508,"ElementsNetType::kElementsRegtest",
             "confidential_address.GetNetType()",(NetType *)local_570,(NetType *)&local_590);
  if (local_508[0] == (string)0x0) {
    testing::Message::Message((Message *)local_570);
    if (local_500.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_500.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x218,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_590,(Message *)local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_590);
    if ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_570._0_8_ + 8))();
      }
      local_570._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_500,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_570._0_4_ = 3;
  EVar3 = cfd::core::ElementsConfidentialAddress::GetAddressType(&local_350);
  local_590._M_dataplus._M_p._0_4_ = EVar3;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_508,"ElementsAddressType::kP2wshAddress",
             "confidential_address.GetAddressType()",(AddressType *)local_570,
             (AddressType *)&local_590);
  if (local_508[0] == (string)0x0) {
    testing::Message::Message((Message *)local_570);
    if (local_500.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_500.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x219,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_590,(Message *)local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_590);
    if ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((AssertHelperData *)local_570._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(_func_int **)local_570._0_8_ + 8))();
      }
      local_570._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_500,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_520.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_520.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_520.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_520.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350.address_._M_dataplus._M_p != &local_350.address_.field_2) {
    operator_delete(local_350.address_._M_dataplus._M_p,
                    local_350.address_.field_2._M_allocated_capacity + 1);
  }
  if (local_350.confidential_key_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.confidential_key_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_350.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.confidential_key_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_350.unblinded_address_);
  cfd::core::Address::~Address(&local_198);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2wshAddressToConfidential) {
  Address address;
  ElementsConfidentialAddress confidential_address;
  ConfidentialKey confidential_key(
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800");

  EXPECT_NO_THROW(
      (address =
          Address(ElementsNetType::kElementsRegtest, WitnessVersion::kVersion0,
                  Script("a91429b1ec079a9c6a45a4e9ab38c3aa3e0ad3dc61f088"),
                  GetElementsAddressFormatList())));
  EXPECT_NO_THROW(
      (confidential_address =
          ElementsConfidentialAddress(address, confidential_key)));
  EXPECT_STREQ(
      "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz",
      confidential_address.GetAddress().c_str());
  EXPECT_STREQ(
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
      confidential_address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6",
               confidential_address.GetHash().GetHex().c_str());
  EXPECT_STREQ("ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",
               confidential_address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(confidential_address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, confidential_address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2wshAddress, confidential_address.GetAddressType());
}